

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSession.cpp
# Opt level: O0

void __thiscall ki::protocol::net::ServerSession::on_keep_alive_response(ServerSession *this)

{
  rep rVar1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_50;
  duration<long,_std::ratio<1L,_1000000000L>_> local_48;
  duration<long,_std::ratio<1L,_1000L>_> local_40 [2];
  parse_error *e;
  time_point local_10;
  ServerSession *this_local;
  
  local_10.__d.__r = (duration)(duration)this;
  Session::read_data<ki::protocol::control::ServerKeepAlive>((Session *)&stack0xffffffffffffffe0);
  control::ServerKeepAlive::~ServerKeepAlive((ServerKeepAlive *)&stack0xffffffffffffffe0);
  local_50.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_48.__r = (rep)std::chrono::operator-
                                (&local_50,
                                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)(&this->field_0x30 + (long)this->_vptr_ServerSession[-3]));
  local_40[0].__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_48);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(local_40);
  *(short *)(&this->field_0x3a + (long)this->_vptr_ServerSession[-3]) = (short)rVar1;
  (&this->field_0x38)[(long)this->_vptr_ServerSession[-3]] = 0;
  return;
}

Assistant:

void ServerSession::on_keep_alive_response()
	{
		// Read the payload data into a structure
		try
		{
			// We don't actually need the data inside, but
			// read it to check if the structure is right.
			read_data<control::ServerKeepAlive>();
		}
		catch (parse_error &e)
		{
			// The KEEP_ALIVE_RSP wasn't valid...
			// Close the session
			close(SessionCloseErrorCode::INVALID_MESSAGE);
			return;
		}

		// Calculate latency and allow for KEEP_ALIVE packets to be sent again
		m_latency = std::chrono::duration_cast<std::chrono::milliseconds>(
			std::chrono::steady_clock::now() - m_last_sent_heartbeat_time
			).count();
		m_waiting_for_keep_alive_response = false;
	}